

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O3

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::LoadWavefrontMesh
          (ChTriangleMeshConnected *this,string *filename,bool load_normals,bool load_uv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  bool bVar7;
  pointer psVar8;
  ostream *poVar9;
  undefined7 in_register_00000009;
  pointer psVar10;
  long lVar11;
  ulong uVar12;
  pointer piVar13;
  ulong uVar14;
  ChVector<double> local_168;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_150;
  string err;
  string warn;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  attrib_t att;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  
  filesystem::path::path((path *)&att,filename);
  bVar7 = filesystem::path::is_file((path *)&att);
  if (!bVar7) {
    __assert_fail("filesystem::path(filename).is_file()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/geometry/ChTriangleMeshConnected.cpp"
                  ,0xf1,
                  "bool chrono::geometry::ChTriangleMeshConnected::LoadWavefrontMesh(const std::string &, bool, bool)"
                 );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish);
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  bVar7 = tinyobj::LoadObj(&att,&shapes,&materials,&warn,&err,(filename->_M_dataplus)._M_p,
                           (char *)0x0,true,true);
  if (bVar7) {
    pCVar4 = (this->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vertices).
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != pCVar4) {
      (this->m_vertices).
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar4;
    }
    pCVar4 = (this->m_normals).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_normals).
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != pCVar4) {
      (this->m_normals).
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar4;
    }
    pCVar5 = (this->m_UV).
             super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_UV).
        super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != pCVar5) {
      (this->m_UV).
      super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar5;
    }
    pCVar6 = (this->m_face_v_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_face_v_indices).
        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar6) {
      (this->m_face_v_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar6;
    }
    pCVar6 = (this->m_face_n_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_face_n_indices).
        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar6) {
      (this->m_face_n_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar6;
    }
    pCVar6 = (this->m_face_uv_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_face_uv_indices).
        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar6) {
      (this->m_face_uv_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar6;
    }
    std::__cxx11::string::_M_assign((string *)&this->m_filename);
    local_150 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                CONCAT44(local_150._4_4_,(int)CONCAT71(in_register_00000009,load_uv));
    if (8 < (ulong)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      lVar11 = 8;
      uVar12 = 0;
      do {
        local_168.m_data[2] =
             (double)*(float *)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar11);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)((long)att.vertices.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar11 + -8);
        local_168.m_data._0_16_ = vcvtps2pd_avx(auVar1);
        std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
        emplace_back<chrono::ChVector<double>>
                  ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                   &this->m_vertices,&local_168);
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0xc;
      } while (uVar12 < (ulong)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) / 3);
    }
    if ((load_normals) &&
       (8 < (ulong)((long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start))) {
      lVar11 = 8;
      uVar12 = 0;
      do {
        local_168.m_data[2] =
             (double)*(float *)((long)att.normals.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar11);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)((long)att.normals.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar11 + -8);
        local_168.m_data._0_16_ = vcvtps2pd_avx(auVar2);
        std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
        emplace_back<chrono::ChVector<double>>
                  ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                   &this->m_normals,&local_168);
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0xc;
      } while (uVar12 < (ulong)((long)att.normals.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)att.normals.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 2) / 3);
    }
    if (((char)local_150 != '\0') &&
       (4 < (ulong)((long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start))) {
      uVar12 = 0;
      do {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *(ulong *)(att.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar12 * 2);
        local_168.m_data._0_16_ = vcvtps2pd_avx(auVar3);
        std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
        emplace_back<chrono::ChVector2<double>>
                  ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)
                   &this->m_UV,(ChVector2<double> *)&local_168);
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)att.texcoords.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)att.texcoords.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2) >> 1);
    }
    if (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_150 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                  &this->m_face_n_indices;
      uVar12 = 0;
      psVar8 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      psVar10 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      do {
        piVar13 = psVar8[uVar12].mesh.indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)psVar8[uVar12].mesh.indices.
                               super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)piVar13 >> 2) *
                       -0x5555555555555555)) {
          lVar11 = 0;
          uVar14 = 0;
          do {
            auVar1 = (undefined1  [16])local_168.m_data._0_16_;
            local_168.m_data[0]._4_4_ = *(undefined4 *)((long)(piVar13 + 1) + lVar11);
            local_168.m_data[0]._0_4_ = *(undefined4 *)((long)&piVar13->vertex_index + lVar11);
            local_168.m_data[1]._4_4_ = auVar1._12_4_;
            local_168.m_data[1]._0_4_ = *(int *)((long)(piVar13 + 2) + lVar11);
            std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
            emplace_back<chrono::ChVector<int>>
                      ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                       &this->m_face_v_indices,(ChVector<int> *)&local_168);
            auVar1 = (undefined1  [16])local_168.m_data._0_16_;
            if ((this->m_normals).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->m_normals).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              piVar13 = shapes.
                        super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar12].mesh.indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_168.m_data[0]._4_4_ = *(undefined4 *)((long)(piVar13 + 1) + 4U + lVar11);
              local_168.m_data[0]._0_4_ = *(undefined4 *)((long)&piVar13->normal_index + lVar11);
              local_168.m_data[1]._4_4_ = auVar1._12_4_;
              local_168.m_data[1]._0_4_ = *(int *)((long)(piVar13 + 2) + 4U + lVar11);
              std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
              emplace_back<chrono::ChVector<int>>(local_150,(ChVector<int> *)&local_168);
            }
            auVar1 = (undefined1  [16])local_168.m_data._0_16_;
            if ((this->m_UV).
                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->m_UV).
                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              piVar13 = shapes.
                        super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar12].mesh.indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_168.m_data[0]._4_4_ = *(undefined4 *)((long)(piVar13 + 1) + 8U + lVar11);
              local_168.m_data[0]._0_4_ = *(undefined4 *)((long)&piVar13->texcoord_index + lVar11);
              local_168.m_data[1]._4_4_ = auVar1._12_4_;
              local_168.m_data[1]._0_4_ = *(int *)((long)(piVar13 + 2) + 8U + lVar11);
              std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
              emplace_back<chrono::ChVector<int>>
                        ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                         &this->m_face_uv_indices,(ChVector<int> *)&local_168);
            }
            uVar14 = uVar14 + 1;
            lVar11 = lVar11 + 0x24;
            piVar13 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar12].mesh.indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            psVar8 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            psVar10 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          } while (uVar14 < (ulong)(((long)shapes.
                                           super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12].mesh.
                                           indices.
                                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)piVar13 >> 2) * -0x5555555555555555) / 3);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)(((long)psVar10 - (long)psVar8 >> 5) * 0x6db6db6db6db6db7));
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error loading OBJ file ",0x17);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"   tiny_obj warning message: ",0x1d);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,warn._M_dataplus._M_p,warn._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"   tiny_obj error message:   ",0x1d);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,err._M_dataplus._M_p,err._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)err._M_dataplus._M_p != &err.field_2) {
    operator_delete(err._M_dataplus._M_p,
                    CONCAT71(err.field_2._M_allocated_capacity._1_7_,err.field_2._M_local_buf[0]) +
                    1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)warn._M_dataplus._M_p != &warn.field_2) {
    operator_delete(warn._M_dataplus._M_p,
                    CONCAT71(warn.field_2._M_allocated_capacity._1_7_,warn.field_2._M_local_buf[0])
                    + 1);
  }
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  if (att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  return bVar7;
}

Assistant:

bool ChTriangleMeshConnected::LoadWavefrontMesh(const std::string& filename, bool load_normals, bool load_uv) {
    assert(filesystem::path(filename).is_file());

    std::vector<tinyobj::shape_t> shapes;
    tinyobj::attrib_t att;
    std::vector<tinyobj::material_t> materials;
    std::string warn;
    std::string err;

    bool success = tinyobj::LoadObj(&att, &shapes, &materials, &warn, &err, filename.c_str());
    if (!success) {
        std::cerr << "Error loading OBJ file " << filename << std::endl;
        std::cerr << "   tiny_obj warning message: " << warn << std::endl;
        std::cerr << "   tiny_obj error message:   " << err << std::endl;
        return false;
    }

    m_vertices.clear();
    m_normals.clear();
    m_UV.clear();
    m_face_v_indices.clear();
    m_face_n_indices.clear();
    m_face_uv_indices.clear();

    m_filename = filename;

    for (size_t i = 0; i < att.vertices.size() / 3; i++) {
        m_vertices.push_back(ChVector<>(att.vertices[3 * i + 0], att.vertices[3 * i + 1], att.vertices[3 * i + 2]));
    }
    if (load_normals) {
        for (size_t i = 0; i < att.normals.size() / 3; i++) {
            m_normals.push_back(ChVector<>(att.normals[3 * i + 0], att.normals[3 * i + 1], att.normals[3 * i + 2]));
        }
    }
    if (load_uv) {
        for (size_t i = 0; i < att.texcoords.size() / 2; i++) {
            m_UV.push_back(ChVector2<>(att.texcoords[2 * i + 0], att.texcoords[2 * i + 1]));
        }
    }

    for (size_t i = 0; i < shapes.size(); i++) {
        for (size_t j = 0; j < shapes[i].mesh.indices.size() / 3; j++) {
            m_face_v_indices.push_back(ChVector<int>(shapes[i].mesh.indices[3 * j + 0].vertex_index,
                                                     shapes[i].mesh.indices[3 * j + 1].vertex_index,
                                                     shapes[i].mesh.indices[3 * j + 2].vertex_index));
            if (m_normals.size() > 0) {
                m_face_n_indices.push_back(ChVector<int>(shapes[i].mesh.indices[3 * j + 0].normal_index,
                                                         shapes[i].mesh.indices[3 * j + 1].normal_index,
                                                         shapes[i].mesh.indices[3 * j + 2].normal_index));
            }
            if (m_UV.size() > 0) {
                m_face_uv_indices.push_back(ChVector<int>(shapes[i].mesh.indices[3 * j + 0].texcoord_index,
                                                          shapes[i].mesh.indices[3 * j + 1].texcoord_index,
                                                          shapes[i].mesh.indices[3 * j + 2].texcoord_index));
            }
        }
    }

    return true;
}